

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5VocabResetCursor(Fts5VocabCursor *pCsr)

{
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x58) = 0;
  sqlite3Fts5IterClose((Fts5IndexIter *)pCsr);
  sqlite3Fts5StructureRelease((void *)0x2956eb);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  sqlite3_free((void *)0x295710);
  *(undefined4 *)(in_RDI + 0x30) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

static void fts5VocabResetCursor(Fts5VocabCursor *pCsr){
  pCsr->rowid = 0;
  sqlite3Fts5IterClose(pCsr->pIter);
  sqlite3Fts5StructureRelease(pCsr->pStruct);
  pCsr->pStruct = 0;
  pCsr->pIter = 0;
  sqlite3_free(pCsr->zLeTerm);
  pCsr->nLeTerm = -1;
  pCsr->zLeTerm = 0;
  pCsr->bEof = 0;
}